

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O0

void __thiscall CTcLibParser::CTcLibParser(CTcLibParser *this,char *lib_name)

{
  char *pcVar1;
  char *in_RDI;
  char lib_path [4096];
  char *in_stack_fffffffffffff000;
  size_t in_stack_fffffffffffff008;
  char *in_stack_fffffffffffff010;
  
  *(undefined ***)in_RDI = &PTR__CTcLibParser_0042f8e0;
  os_get_path_name(in_stack_fffffffffffff010,in_stack_fffffffffffff008,in_stack_fffffffffffff000);
  pcVar1 = lib_copy_str(in_RDI);
  *(char **)(in_RDI + 0x10) = pcVar1;
  pcVar1 = lib_copy_str(in_RDI);
  *(char **)(in_RDI + 8) = pcVar1;
  in_RDI[0x18] = '\0';
  in_RDI[0x19] = '\0';
  in_RDI[0x1a] = '\0';
  in_RDI[0x1b] = '\0';
  in_RDI[0x20] = '\0';
  in_RDI[0x21] = '\0';
  in_RDI[0x22] = '\0';
  in_RDI[0x23] = '\0';
  in_RDI[0x24] = '\0';
  in_RDI[0x25] = '\0';
  in_RDI[0x26] = '\0';
  in_RDI[0x27] = '\0';
  return;
}

Assistant:

CTcLibParser::CTcLibParser(const char *lib_name)
{
    char lib_path[OSFNMAX];

    /* 
     *   Extract the library's directory path.  Since files within a library
     *   are always relative to the directory containing the library itself,
     *   we use the full path to the library as the starting point for each
     *   file found within the library.  
     */
    os_get_path_name(lib_path, sizeof(lib_path), lib_name);

    /* remember the library path */
    lib_path_ = lib_copy_str(lib_path);

    /* remember the name of the library */
    lib_name_ = lib_copy_str(lib_name);

    /* no errors yet */
    err_cnt_ = 0;

    /* no lines read yet */
    linenum_ = 0;
}